

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O2

void remoteUnref(mpt_metatype *mt)

{
  long lVar1;
  
  lVar1 = mpt_refcount_lower(mt + 4);
  if (lVar1 != 0) {
    return;
  }
  mpt_connection_fini((mpt_connection *)(mt + 5));
  free(mt);
  return;
}

Assistant:

static void remoteUnref(MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, mt, _in);
	uintptr_t c;
	if ((c = mpt_refcount_lower(&od->_ref))) {
		return;
	}
	mpt_connection_fini(&od->con);
	free(od);
}